

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QMatchData * __thiscall
QMap<QString,_QMatchData>::operator[](QMap<QString,_QMatchData> *this,QString *key)

{
  QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QMatchData>_>,_bool> pVar3;
  QMap<QString,_QMatchData> copy;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
  local_70;
  pair<const_QString,_QMatchData> local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_70.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_*>
          )(QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
            *)0x0;
  }
  else {
    local_70.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_70.d.ptr !=
        (QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
         *)local_70.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
                          *)local_70.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QMatchData>,_std::_Select1st<std::pair<const_QString,_QMatchData>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_68.first.d.d = (key->d).d;
    local_68.first.d.ptr = (key->d).ptr;
    local_68.first.d.size = (key->d).size;
    if (&(local_68.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.first.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.first.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68.second.indices.v = false;
    local_68.second.indices.vector.d.d = (Data *)0x0;
    local_68.second.indices.vector.d.ptr = (int *)0x0;
    local_68.second.indices.vector.d.size = 0;
    local_68.second.indices.f = 0;
    local_68.second.indices.t = -1;
    local_68.second.exactMatchIndex = -1;
    local_68.second.partial = false;
    pVar3 = std::
            _Rb_tree<QString,std::pair<QString_const,QMatchData>,std::_Select1st<std::pair<QString_const,QMatchData>>,std::less<QString>,std::allocator<std::pair<QString_const,QMatchData>>>
            ::_M_insert_unique<std::pair<QString_const,QMatchData>>
                      ((_Rb_tree<QString,std::pair<QString_const,QMatchData>,std::_Select1st<std::pair<QString_const,QMatchData>>,std::less<QString>,std::allocator<std::pair<QString_const,QMatchData>>>
                        *)&pQVar1->m,&local_68);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    if (&(local_68.second.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.second.indices.vector.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.second.indices.vector.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.second.indices.vector.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.second.indices.vector.d.d)->super_QArrayData,4,0x10);
      }
    }
    if (&(local_68.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_68.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_68.first.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QMatchData *)&iVar2._M_node[1]._M_right;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }